

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::emplace<QTextLayout::FormatRange_const&>
          (QMovableArrayOps<QTextLayout::FormatRange> *this,qsizetype i,FormatRange *args)

{
  FormatRange **ppFVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  FormatRange *pFVar5;
  int iVar6;
  long in_FS_OFFSET;
  bool bVar7;
  Inserter local_70;
  undefined8 local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
           super_QArrayDataPointer<QTextLayout::FormatRange>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0043078a:
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_48._0_4_ = args->start;
    local_48._4_4_ = args->length;
    QTextFormat::QTextFormat((QTextFormat *)&puStack_40,&(args->format).super_QTextFormat);
    bVar7 = (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
            super_QArrayDataPointer<QTextLayout::FormatRange>.size != 0;
    QArrayDataPointer<QTextLayout::FormatRange>::detachAndGrow
              ((QArrayDataPointer<QTextLayout::FormatRange> *)this,(uint)(i == 0 && bVar7),1,
               (FormatRange **)0x0,(QArrayDataPointer<QTextLayout::FormatRange> *)0x0);
    if (i == 0 && bVar7) {
      pFVar5 = (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
               super_QArrayDataPointer<QTextLayout::FormatRange>.ptr;
      pFVar5[-1].start = (undefined4)local_48;
      pFVar5[-1].length = local_48._4_4_;
      QTextFormat::QTextFormat(&pFVar5[-1].format.super_QTextFormat,(QTextFormat *)&puStack_40);
      ppFVar1 = &(this->super_QGenericArrayOps<QTextLayout::FormatRange>).
                 super_QArrayDataPointer<QTextLayout::FormatRange>.ptr;
      *ppFVar1 = *ppFVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QTextLayout::FormatRange>).
                super_QArrayDataPointer<QTextLayout::FormatRange>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      local_70.displaceTo =
           (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
           super_QArrayDataPointer<QTextLayout::FormatRange>.ptr;
      local_70.displaceFrom = local_70.displaceTo + i;
      local_70.displaceTo = local_70.displaceTo + i + 1;
      local_70.nInserts = 1;
      local_70.bytes =
           ((this->super_QGenericArrayOps<QTextLayout::FormatRange>).
            super_QArrayDataPointer<QTextLayout::FormatRange>.size - i) * 0x18;
      local_70.data = (QArrayDataPointer<QTextLayout::FormatRange> *)this;
      memmove(local_70.displaceTo,local_70.displaceFrom,local_70.bytes);
      (local_70.displaceFrom)->start = (undefined4)local_48;
      (local_70.displaceFrom)->length = local_48._4_4_;
      QTextFormat::QTextFormat
                (&((local_70.displaceFrom)->format).super_QTextFormat,(QTextFormat *)&puStack_40);
      local_70.displaceFrom = local_70.displaceFrom + 1;
      Inserter::~Inserter(&local_70);
    }
    QTextFormat::~QTextFormat((QTextFormat *)&puStack_40);
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
            super_QArrayDataPointer<QTextLayout::FormatRange>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QGenericArrayOps<QTextLayout::FormatRange>).
                      super_QArrayDataPointer<QTextLayout::FormatRange>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x5555555555555555)) {
      iVar6 = args->length;
      pFVar5 = (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
               super_QArrayDataPointer<QTextLayout::FormatRange>.ptr + lVar4;
      pFVar5->start = args->start;
      pFVar5->length = iVar6;
      QTextFormat::QTextFormat
                (&(pFVar5->format).super_QTextFormat,&(args->format).super_QTextFormat);
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((FormatRange *)
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
          super_QArrayDataPointer<QTextLayout::FormatRange>.ptr)) goto LAB_0043078a;
      pFVar5 = (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
               super_QArrayDataPointer<QTextLayout::FormatRange>.ptr;
      iVar6 = args->length;
      pFVar5[-1].start = args->start;
      pFVar5[-1].length = iVar6;
      QTextFormat::QTextFormat
                (&pFVar5[-1].format.super_QTextFormat,&(args->format).super_QTextFormat);
      ppFVar1 = &(this->super_QGenericArrayOps<QTextLayout::FormatRange>).
                 super_QArrayDataPointer<QTextLayout::FormatRange>.ptr;
      *ppFVar1 = *ppFVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QTextLayout::FormatRange>).
              super_QArrayDataPointer<QTextLayout::FormatRange>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }